

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_> *
__thiscall
libtorrent::aux::torrent::trackers
          (vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           *__return_storage_ptr__,torrent *this)

{
  protocol_version idx;
  byte bVar1;
  undefined2 uVar2;
  int iVar3;
  error_category *peVar4;
  undefined3 uVar5;
  bool bVar6;
  size_t __n;
  reference paVar7;
  reference pvVar8;
  size_type __n_00;
  const_iterator ppVar9;
  value_type *pvVar10;
  value_type *pvVar11;
  protocol_version v;
  const_iterator __end4;
  const_iterator __begin4;
  initializer_list<libtorrent::protocol_version> local_98;
  initializer_list<libtorrent::protocol_version> *local_88;
  initializer_list<libtorrent::protocol_version> *__range4;
  value_type *aep;
  announce_endpoint *ep;
  const_iterator __end3;
  const_iterator __begin3;
  vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
  *__range3;
  value_type *tr;
  announce_entry *t;
  const_iterator __end2;
  const_iterator __begin2;
  tracker_list *__range2;
  torrent *this_local;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_> *ret;
  
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::vector(__return_storage_ptr__);
  __n = tracker_list::size(&this->m_trackers);
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::reserve(__return_storage_ptr__,__n);
  tracker_list::begin((tracker_list *)&__end2);
  tracker_list::end((tracker_list *)&t);
  while (bVar6 = boost::intrusive::operator!=
                           (&__end2,(list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_true>
                                     *)&t), bVar6) {
    paVar7 = boost::intrusive::
             list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_true>
             ::operator*(&__end2);
    ::std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
    ::emplace_back<std::__cxx11::string_const&>
              ((vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
                *)__return_storage_ptr__,&paVar7->url);
    pvVar8 = ::std::
             vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             ::back(__return_storage_ptr__);
    pvVar8->field_0x5a = pvVar8->field_0x5a & 0xf0 | paVar7->field_0x6e & 0xf;
    ::std::__cxx11::string::operator=((string *)&pvVar8->trackerid,(string *)&paVar7->trackerid);
    pvVar8->field_0x5a = pvVar8->field_0x5a & 0xef | paVar7->field_0x6e & 0x10;
    pvVar8->tier = paVar7->tier;
    pvVar8->fail_limit = paVar7->fail_limit;
    __n_00 = ::std::
             vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
             ::size(&paVar7->endpoints);
    ::std::
    vector<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
    ::reserve(&pvVar8->endpoints,__n_00);
    __end3 = ::std::
             vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
             ::begin(&paVar7->endpoints);
    ep = (announce_endpoint *)
         ::std::
         vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
         ::end(&paVar7->endpoints);
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
                                       *)&ep), bVar6) {
      aep = (value_type *)
            __gnu_cxx::
            __normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
            ::operator*(&__end3);
      ::std::
      vector<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
      ::emplace_back<>(&pvVar8->endpoints);
      __range4 = (initializer_list<libtorrent::protocol_version> *)
                 ::std::
                 vector<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
                 ::back(&pvVar8->endpoints);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=
                ((basic_endpoint<boost::asio::ip::tcp> *)__range4,&aep->local_endpoint);
      *(byte *)((long)&__range4[0xf]._M_array + 6) = (byte)(aep->next_announce).__d.__r & 1;
      __begin4._6_1_ = 0;
      __begin4._7_1_ = 1;
      local_98._M_array = (iterator)((long)&__begin4 + 6);
      local_98._M_len = 2;
      local_88 = &local_98;
      __end4 = ::std::initializer_list<libtorrent::protocol_version>::begin(local_88);
      ppVar9 = ::std::initializer_list<libtorrent::protocol_version>::end(local_88);
      for (; __end4 != ppVar9; __end4 = __end4 + 1) {
        idx = *__end4;
        pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                *)&aep->info_hashes,idx);
        pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                                *)(__range4 + 2),idx);
        ::std::__cxx11::string::operator=((string *)pvVar11,(string *)pvVar10);
        pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                *)&aep->info_hashes,idx);
        pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                                *)(__range4 + 2),idx);
        bVar6 = (pvVar10->last_error).failed_;
        uVar5 = *(undefined3 *)&(pvVar10->last_error).field_0x5;
        peVar4 = (pvVar10->last_error).cat_;
        (pvVar11->last_error).val_ = (pvVar10->last_error).val_;
        (pvVar11->last_error).failed_ = bVar6;
        *(undefined3 *)&(pvVar11->last_error).field_0x5 = uVar5;
        (pvVar11->last_error).cat_ = peVar4;
        pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                *)&aep->info_hashes,idx);
        pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                                *)(__range4 + 2),idx);
        (pvVar11->next_announce).__d.__r = (pvVar10->next_announce).__d.__r;
        pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                *)&aep->info_hashes,idx);
        pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                                *)(__range4 + 2),idx);
        (pvVar11->min_announce).__d.__r = (pvVar10->min_announce).__d.__r;
        pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                *)&aep->info_hashes,idx);
        iVar3 = pvVar10->scrape_incomplete;
        pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                                *)(__range4 + 2),idx);
        pvVar11->scrape_incomplete = iVar3;
        pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                *)&aep->info_hashes,idx);
        iVar3 = pvVar10->scrape_complete;
        pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                                *)(__range4 + 2),idx);
        pvVar11->scrape_complete = iVar3;
        pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                *)&aep->info_hashes,idx);
        iVar3 = pvVar10->scrape_downloaded;
        pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                                *)(__range4 + 2),idx);
        pvVar11->scrape_downloaded = iVar3;
        pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                *)&aep->info_hashes,idx);
        bVar1 = pvVar10->field_0x44;
        pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                                *)(__range4 + 2),idx);
        *(ushort *)&pvVar11->field_0x44 =
             (ushort)*(undefined4 *)&pvVar11->field_0x44 & 0xff80 | (ushort)(bVar1 & 0x7f);
        pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                *)&aep->info_hashes,idx);
        bVar1 = pvVar10->field_0x44;
        pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                                *)(__range4 + 2),idx);
        *(ushort *)&pvVar11->field_0x44 =
             (ushort)*(undefined4 *)&pvVar11->field_0x44 & 0xff7f | (ushort)(bVar1 >> 7) << 7;
        pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                *)&aep->info_hashes,idx);
        bVar1 = pvVar10->field_0x45;
        pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                                *)(__range4 + 2),idx);
        *(ushort *)&pvVar11->field_0x44 =
             (ushort)*(undefined4 *)&pvVar11->field_0x44 & 0xfeff | (ushort)(bVar1 & 1) << 8;
        pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                *)&aep->info_hashes,idx);
        uVar2 = *(undefined2 *)&pvVar10->field_0x44;
        pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                                *)(__range4 + 2),idx);
        *(ushort *)&pvVar11->field_0x44 =
             (ushort)*(undefined4 *)&pvVar11->field_0x44 & 0xfdff |
             (ushort)((byte)((ushort)uVar2 >> 9) & 1) << 9;
        pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                *)&aep->info_hashes,idx);
        uVar2 = *(undefined2 *)&pvVar10->field_0x44;
        pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                  ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                                *)(__range4 + 2),idx);
        *(ushort *)&pvVar11->field_0x44 =
             *(ushort *)&pvVar11->field_0x44 & 0xfbff |
             (ushort)((byte)((ushort)uVar2 >> 10) & 1) << 10;
      }
      pvVar11 = container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                ::operator[]((container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
                              *)(__range4 + 2),V1);
      ::std::__cxx11::string::operator=((string *)&__range4[0xb]._M_len,(string *)pvVar11);
      pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                              *)&aep->info_hashes,V1);
      *(int *)&__range4[0xe]._M_len = pvVar10->scrape_incomplete;
      pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                              *)&aep->info_hashes,V1);
      *(int *)((long)&__range4[0xe]._M_len + 4) = pvVar10->scrape_complete;
      pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                              *)&aep->info_hashes,V1);
      *(int *)&__range4[0xf]._M_array = pvVar10->scrape_downloaded;
      pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                              *)&aep->info_hashes,V1);
      *(ushort *)((long)&__range4[0xf]._M_array + 4) =
           (ushort)*(undefined4 *)((long)&__range4[0xf]._M_array + 4) & 0xfdff |
           *(ushort *)&pvVar10->field_0x44 & 0x200;
      pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                              *)&aep->info_hashes,V1);
      peVar4 = (pvVar10->last_error).cat_;
      __range4[0xd]._M_len = *(size_type *)&pvVar10->last_error;
      __range4[0xe]._M_array = (iterator)peVar4;
      pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                              *)&aep->info_hashes,V1);
      *(ushort *)((long)&__range4[0xf]._M_array + 4) =
           (ushort)*(undefined4 *)((long)&__range4[0xf]._M_array + 4) & 0xff80 |
           *(ushort *)&pvVar10->field_0x44 & 0x7f;
      pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                              *)&aep->info_hashes,V1);
      *(rep_conflict *)&__range4[0xb]._M_array = (pvVar10->next_announce).__d.__r;
      pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                              *)&aep->info_hashes,V1);
      *(rep_conflict *)((long)&__range4[0xb]._M_array + 4) = (pvVar10->min_announce).__d.__r;
      pvVar10 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                              *)&aep->info_hashes,V1);
      *(ushort *)((long)&__range4[0xf]._M_array + 4) =
           *(ushort *)((long)&__range4[0xf]._M_array + 4) & 0xff7f |
           (ushort)((byte)pvVar10->field_0x44 >> 7) << 7;
      __gnu_cxx::
      __normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
      ::operator++(&__end3);
    }
    boost::intrusive::
    list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_true>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<lt::announce_entry> torrent::trackers() const
	{
		std::vector<lt::announce_entry> ret;
		ret.reserve(m_trackers.size());
		for (auto const& t : m_trackers)
		{
			ret.emplace_back(t.url);
			auto& tr = ret.back();
			tr.source = t.source;
			tr.trackerid = t.trackerid;
			tr.verified = t.verified;
			tr.tier = t.tier;
			tr.fail_limit = t.fail_limit;
			tr.endpoints.reserve(t.endpoints.size());
			for (auto const& ep : t.endpoints)
			{
				tr.endpoints.emplace_back();
				auto& aep = tr.endpoints.back();
				aep.local_endpoint = ep.local_endpoint;
				aep.enabled = ep.enabled;

				for (protocol_version v : {protocol_version::V1, protocol_version::V2})
				{
					aep.info_hashes[v].message = ep.info_hashes[v].message;
					aep.info_hashes[v].last_error = ep.info_hashes[v].last_error;
					aep.info_hashes[v].next_announce = ep.info_hashes[v].next_announce;
					aep.info_hashes[v].min_announce = ep.info_hashes[v].min_announce;
					aep.info_hashes[v].scrape_incomplete = ep.info_hashes[v].scrape_incomplete;
					aep.info_hashes[v].scrape_complete = ep.info_hashes[v].scrape_complete;
					aep.info_hashes[v].scrape_downloaded = ep.info_hashes[v].scrape_downloaded;
					aep.info_hashes[v].fails = ep.info_hashes[v].fails;
					aep.info_hashes[v].updating = ep.info_hashes[v].updating;
					aep.info_hashes[v].start_sent = ep.info_hashes[v].start_sent;
					aep.info_hashes[v].complete_sent = ep.info_hashes[v].complete_sent;
					aep.info_hashes[v].triggered_manually = ep.info_hashes[v].triggered_manually;
#if TORRENT_ABI_VERSION == 1
					tr.complete_sent |= ep.info_hashes[v].complete_sent;
#endif
				}
#if TORRENT_ABI_VERSION <= 2
#include "libtorrent/aux_/disable_warnings_push.hpp"
				aep.message = aep.info_hashes[protocol_version::V1].message;
				aep.scrape_incomplete = ep.info_hashes[protocol_version::V1].scrape_incomplete;
				aep.scrape_complete = ep.info_hashes[protocol_version::V1].scrape_complete;
				aep.scrape_downloaded = ep.info_hashes[protocol_version::V1].scrape_downloaded;
				aep.complete_sent = ep.info_hashes[protocol_version::V1].complete_sent;
				aep.last_error = ep.info_hashes[protocol_version::V1].last_error;
				aep.fails = ep.info_hashes[protocol_version::V1].fails;
				aep.next_announce = ep.info_hashes[protocol_version::V1].next_announce;
				aep.min_announce = ep.info_hashes[protocol_version::V1].min_announce;
				aep.updating = ep.info_hashes[protocol_version::V1].updating;
#include "libtorrent/aux_/disable_warnings_pop.hpp"
#endif
			}
		}
		return ret;
	}